

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O0

int __thiscall miniros::NodeHandle::shutdown(NodeHandle *this,int __fd,int __how)

{
  bool bVar1;
  pointer pwVar2;
  element_type *this_00;
  int __how_00;
  int __fd_00;
  ImplPtr impl_3;
  iterator end_3;
  iterator it_3;
  ImplPtr impl_2;
  iterator end_2;
  iterator it_2;
  ImplPtr impl_1;
  iterator end_1;
  iterator it_1;
  ImplPtr impl;
  iterator end;
  iterator it;
  vector<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>
  *in_stack_ffffffffffffff58;
  weak_ptr<miniros::Publisher::Impl> *in_stack_ffffffffffffff68;
  __normal_iterator<std::weak_ptr<miniros::ServiceClient::Impl>_*,_std::vector<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>_>
  in_stack_ffffffffffffff80;
  __shared_ptr local_78 [16];
  weak_ptr<miniros::ServiceServer::Impl> *local_68;
  __normal_iterator<std::weak_ptr<miniros::ServiceServer::Impl>_*,_std::vector<std::weak_ptr<miniros::ServiceServer::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceServer::Impl>_>_>_>
  local_60;
  __shared_ptr local_58 [16];
  weak_ptr<miniros::Publisher::Impl> *local_48;
  __normal_iterator<std::weak_ptr<miniros::Publisher::Impl>_*,_std::vector<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>_>
  local_40 [3];
  __shared_ptr local_28 [16];
  weak_ptr<miniros::Subscriber::Impl> *local_18;
  __normal_iterator<std::weak_ptr<miniros::Subscriber::Impl>_*,_std::vector<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>_>
  local_10;
  NodeHandle *local_8;
  
  local_8 = this;
  local_10._M_current =
       (weak_ptr<miniros::Subscriber::Impl> *)
       std::
       vector<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>
       ::begin((vector<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>
                *)in_stack_ffffffffffffff58);
  local_18 = (weak_ptr<miniros::Subscriber::Impl> *)
             std::
             vector<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>
             ::end((vector<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>
                    *)in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::weak_ptr<miniros::Subscriber::Impl>_*,_std::vector<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>_>
                             *)this,(__normal_iterator<std::weak_ptr<miniros::Subscriber::Impl>_*,_std::vector<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>_>
                                     *)in_stack_ffffffffffffff58), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<miniros::Subscriber::Impl>_*,_std::vector<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>_>
    ::operator->(&local_10);
    std::weak_ptr<miniros::Subscriber::Impl>::lock
              ((weak_ptr<miniros::Subscriber::Impl> *)in_stack_ffffffffffffff68);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_28);
    if (bVar1) {
      std::__shared_ptr_access<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<miniros::Subscriber::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x479a6f);
      Subscriber::Impl::unsubscribe((Impl *)this);
    }
    std::shared_ptr<miniros::Subscriber::Impl>::~shared_ptr
              ((shared_ptr<miniros::Subscriber::Impl> *)0x479aa8);
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<miniros::Subscriber::Impl>_*,_std::vector<std::weak_ptr<miniros::Subscriber::Impl>,_std::allocator<std::weak_ptr<miniros::Subscriber::Impl>_>_>_>
    ::operator++(&local_10);
  }
  local_40[0]._M_current =
       (weak_ptr<miniros::Publisher::Impl> *)
       std::
       vector<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>
       ::begin(in_stack_ffffffffffffff58);
  local_48 = (weak_ptr<miniros::Publisher::Impl> *)
             std::
             vector<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>
             ::end(in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::weak_ptr<miniros::Publisher::Impl>_*,_std::vector<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>_>
                             *)this,(__normal_iterator<std::weak_ptr<miniros::Publisher::Impl>_*,_std::vector<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>_>
                                     *)in_stack_ffffffffffffff58), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<miniros::Publisher::Impl>_*,_std::vector<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>_>
    ::operator->(local_40);
    std::weak_ptr<miniros::Publisher::Impl>::lock(in_stack_ffffffffffffff68);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_58);
    if (bVar1) {
      std::__shared_ptr_access<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::Publisher::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x479b2f);
      Publisher::Impl::unadvertise((Impl *)in_stack_ffffffffffffff80._M_current);
    }
    std::shared_ptr<miniros::Publisher::Impl>::~shared_ptr
              ((shared_ptr<miniros::Publisher::Impl> *)0x479b62);
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<miniros::Publisher::Impl>_*,_std::vector<std::weak_ptr<miniros::Publisher::Impl>,_std::allocator<std::weak_ptr<miniros::Publisher::Impl>_>_>_>
    ::operator++(local_40);
  }
  local_60._M_current =
       (weak_ptr<miniros::ServiceServer::Impl> *)
       std::
       vector<std::weak_ptr<miniros::ServiceServer::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceServer::Impl>_>_>
       ::begin((vector<std::weak_ptr<miniros::ServiceServer::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceServer::Impl>_>_>
                *)in_stack_ffffffffffffff58);
  local_68 = (weak_ptr<miniros::ServiceServer::Impl> *)
             std::
             vector<std::weak_ptr<miniros::ServiceServer::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceServer::Impl>_>_>
             ::end((vector<std::weak_ptr<miniros::ServiceServer::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceServer::Impl>_>_>
                    *)in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::weak_ptr<miniros::ServiceServer::Impl>_*,_std::vector<std::weak_ptr<miniros::ServiceServer::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceServer::Impl>_>_>_>
                             *)this,(__normal_iterator<std::weak_ptr<miniros::ServiceServer::Impl>_*,_std::vector<std::weak_ptr<miniros::ServiceServer::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceServer::Impl>_>_>_>
                                     *)in_stack_ffffffffffffff58), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<miniros::ServiceServer::Impl>_*,_std::vector<std::weak_ptr<miniros::ServiceServer::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceServer::Impl>_>_>_>
    ::operator->(&local_60);
    std::weak_ptr<miniros::ServiceServer::Impl>::lock
              ((weak_ptr<miniros::ServiceServer::Impl> *)in_stack_ffffffffffffff68);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_78);
    if (bVar1) {
      std::
      __shared_ptr_access<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x479bee);
      ServiceServer::Impl::unadvertise((Impl *)this);
    }
    std::shared_ptr<miniros::ServiceServer::Impl>::~shared_ptr
              ((shared_ptr<miniros::ServiceServer::Impl> *)0x479c21);
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<miniros::ServiceServer::Impl>_*,_std::vector<std::weak_ptr<miniros::ServiceServer::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceServer::Impl>_>_>_>
    ::operator++(&local_60);
  }
  std::
  vector<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>
  ::begin((vector<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>
           *)in_stack_ffffffffffffff58);
  std::
  vector<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>
  ::end((vector<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>
         *)in_stack_ffffffffffffff58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::weak_ptr<miniros::ServiceClient::Impl>_*,_std::vector<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>_>
                             *)this,(__normal_iterator<std::weak_ptr<miniros::ServiceClient::Impl>_*,_std::vector<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>_>
                                     *)in_stack_ffffffffffffff58), bVar1) {
    pwVar2 = __gnu_cxx::
             __normal_iterator<std::weak_ptr<miniros::ServiceClient::Impl>_*,_std::vector<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>_>
             ::operator->((__normal_iterator<std::weak_ptr<miniros::ServiceClient::Impl>_*,_std::vector<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>_>
                           *)&stack0xffffffffffffff80);
    __fd_00 = (int)pwVar2;
    std::weak_ptr<miniros::ServiceClient::Impl>::lock
              ((weak_ptr<miniros::ServiceClient::Impl> *)in_stack_ffffffffffffff68);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffff68);
    if (bVar1) {
      this_00 = std::
                __shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<miniros::ServiceClient::Impl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x479cad);
      ServiceClient::Impl::shutdown(this_00,__fd_00,__how_00);
    }
    std::shared_ptr<miniros::ServiceClient::Impl>::~shared_ptr
              ((shared_ptr<miniros::ServiceClient::Impl> *)0x479cdd);
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<miniros::ServiceClient::Impl>_*,_std::vector<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>_>
    ::operator++((__normal_iterator<std::weak_ptr<miniros::ServiceClient::Impl>_*,_std::vector<std::weak_ptr<miniros::ServiceClient::Impl>,_std::allocator<std::weak_ptr<miniros::ServiceClient::Impl>_>_>_>
                  *)&stack0xffffffffffffff80);
  }
  this->ok_ = false;
  return (int)this;
}

Assistant:

void NodeHandle::shutdown()
{
  {
    NodeHandleBackingCollection::V_SubImpl::iterator it = collection_->subs_.begin();
    NodeHandleBackingCollection::V_SubImpl::iterator end = collection_->subs_.end();
    for (; it != end; ++it)
    {
      Subscriber::ImplPtr impl = it->lock();

      if (impl)
      {
        impl->unsubscribe();
      }
    }
  }

  {
    NodeHandleBackingCollection::V_PubImpl::iterator it = collection_->pubs_.begin();
    NodeHandleBackingCollection::V_PubImpl::iterator end = collection_->pubs_.end();
    for (; it != end; ++it)
    {
      Publisher::ImplPtr impl = it->lock();

      if (impl)
      {
        impl->unadvertise();
      }
    }
  }

  {
    NodeHandleBackingCollection::V_SrvImpl::iterator it = collection_->srvs_.begin();
    NodeHandleBackingCollection::V_SrvImpl::iterator end = collection_->srvs_.end();
    for (; it != end; ++it)
    {
      ServiceServer::ImplPtr impl = it->lock();

      if (impl)
      {
        impl->unadvertise();
      }
    }
  }

  {
    NodeHandleBackingCollection::V_SrvCImpl::iterator it = collection_->srv_cs_.begin();
    NodeHandleBackingCollection::V_SrvCImpl::iterator end = collection_->srv_cs_.end();
    for (; it != end; ++it)
    {
      ServiceClient::ImplPtr impl = it->lock();

      if (impl)
      {
        impl->shutdown();
      }
    }
  }

  ok_ = false;
}